

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_1::ComputePipeline::Resources::Resources
          (Resources *this,Environment *env,Parameters *param_2)

{
  undefined3 uVar1;
  VkDescriptorType VVar2;
  deUint32 dVar3;
  VkShaderStageFlags VVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer pBVar7;
  pointer pBVar8;
  value_type *__x;
  ulong uVar9;
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  bindings;
  undefined1 local_b8 [24];
  VkAllocationCallbacks *pVStack_a0;
  undefined1 local_98 [8];
  _Alloc_hider _Stack_90;
  pointer local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_80;
  pointer local_70;
  Parameters local_60;
  value_type local_48;
  
  local_b8._0_8_ = (pointer)(local_b8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"comp","");
  local_98._0_4_ = VK_SHADER_STAGE_COMPUTE_BIT;
  _Stack_90._M_p = (pointer)&aStack_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_90,local_b8._0_8_,
             (undefined1 *)((long)(deUint32 *)local_b8._8_8_ + local_b8._0_8_));
  Dependency<vkt::api::(anonymous_namespace)::ShaderModule>::Dependency
            (&this->shaderModule,env,(Parameters *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_90._M_p != &aStack_80) {
    operator_delete(_Stack_90._M_p,aStack_80._M_allocated_capacity + 1);
  }
  if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_,(ulong)((long)(deUint32 *)local_b8._16_8_ + 1));
  }
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (pointer)0x0;
  local_b8._16_8_ = (pointer)0x0;
  local_48.binding = 0;
  local_48.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  local_48.descriptorCount = 1;
  local_48.stageFlags = 0x20;
  local_48.useImmutableSampler = false;
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::push_back((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
               *)local_b8,&local_48);
  __x = &local_48;
  local_48.binding = 1;
  local_48.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  local_48.descriptorCount = 1;
  local_48.stageFlags = 0x20;
  local_48.useImmutableSampler = false;
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ::push_back((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
               *)local_b8,__x);
  uVar6 = local_b8._8_8_;
  uVar5 = local_b8._0_8_;
  uVar9 = local_b8._8_8_ - local_b8._0_8_;
  pBVar7 = std::
           _Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
           ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
                          *)(((long)uVar9 >> 2) * -0x3333333333333333),(size_t)__x);
  local_60.bindings.
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)pBVar7 + uVar9);
  local_60.bindings.
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ._M_impl.super__Vector_impl_data._M_finish = pBVar7;
  for (pBVar8 = (pointer)uVar5; pBVar8 != (pointer)uVar6; pBVar8 = pBVar8 + 1) {
    uVar1 = *(undefined3 *)&pBVar8->field_0x11;
    (local_60.bindings.
     super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
     ._M_impl.super__Vector_impl_data._M_finish)->useImmutableSampler = pBVar8->useImmutableSampler;
    *(undefined3 *)
     &(local_60.bindings.
       super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
       ._M_impl.super__Vector_impl_data._M_finish)->field_0x11 = uVar1;
    VVar2 = pBVar8->descriptorType;
    dVar3 = pBVar8->descriptorCount;
    VVar4 = pBVar8->stageFlags;
    (local_60.bindings.
     super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
     ._M_impl.super__Vector_impl_data._M_finish)->binding = pBVar8->binding;
    (local_60.bindings.
     super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
     ._M_impl.super__Vector_impl_data._M_finish)->descriptorType = VVar2;
    (local_60.bindings.
     super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
     ._M_impl.super__Vector_impl_data._M_finish)->descriptorCount = dVar3;
    (local_60.bindings.
     super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
     ._M_impl.super__Vector_impl_data._M_finish)->stageFlags = VVar4;
    local_60.bindings.
    super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_60.bindings.
         super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_60.bindings.
  super__Vector_base<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters::Binding>_>
  ._M_impl.super__Vector_impl_data._M_start = pBVar7;
  if ((pointer)uVar5 != (pointer)0x0) {
    operator_delete((void *)uVar5,local_b8._16_8_ - uVar5);
  }
  PipelineLayout::Parameters::singleDescriptorSet((Parameters *)local_98,&local_60);
  Dependency<vkt::api::(anonymous_namespace)::PipelineLayout>::Dependency
            (&this->layout,env,(Parameters *)local_98);
  if ((void *)aStack_80._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)aStack_80._M_allocated_capacity,(long)local_70 - aStack_80._0_8_);
  }
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ::~vector((vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
             *)local_98);
  if (pBVar7 != (pointer)0x0) {
    operator_delete(pBVar7,uVar9);
  }
  _Stack_90._M_p = (pointer)0x0;
  local_88 = (pointer)0x0;
  aStack_80._M_allocated_capacity = 0;
  aStack_80._8_8_ = 0;
  local_98 = (undefined1  [8])0x11;
  ::vk::createPipelineCache
            ((Move<vk::Handle<(vk::HandleType)15>_> *)local_b8,env->vkd,env->device,
             (VkPipelineCacheCreateInfo *)local_98,env->allocationCallbacks);
  (this->pipelineCache).object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
  m_device = (VkDevice)local_b8._16_8_;
  (this->pipelineCache).object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
  m_allocator = pVStack_a0;
  (this->pipelineCache).object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.
  m_internal = local_b8._0_8_;
  (this->pipelineCache).object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_b8._8_8_;
  return;
}

Assistant:

Resources (const Environment& env, const Parameters&)
			: shaderModule		(env, ShaderModule::Parameters(VK_SHADER_STAGE_COMPUTE_BIT, "comp"))
			, layout			(env, PipelineLayout::Parameters::singleDescriptorSet(getDescriptorSetLayout()))
			, pipelineCache		(env, PipelineCache::Parameters())
		{}